

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O1

double __thiscall Creature::make_fitness(Creature *this)

{
  Chromosome *this_00;
  int iVar1;
  World *pWVar2;
  pointer psVar3;
  genes_t *pgVar4;
  undefined4 extraout_var;
  ulong gene;
  size_t chrom;
  double dVar5;
  undefined1 auStack_78 [8];
  vector<boost::any,_std::allocator<boost::any>_> av;
  shared_ptr<Chromosome> chr;
  double local_40;
  any local_38;
  
  local_40 = 0.0;
  if (((this->pntpop != (Population *)0x0) &&
      (pWVar2 = Population::get_world(this->pntpop), pWVar2 != (World *)0x0)) &&
     (psVar3 = (this->chroms).
               super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->chroms).
     super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar3)) {
    local_40 = 0.0;
    chrom = 0;
    do {
      this_00 = psVar3[chrom].px;
      chr.px = (element_type *)psVar3[chrom].pn.pi_;
      if (chr.px != (element_type *)0x0) {
        LOCK();
        *(uint_least32_t *)&(chr.px)->CHROMOSOME_SIZE =
             (uint_least32_t)(chr.px)->CHROMOSOME_SIZE + 1;
        UNLOCK();
      }
      if (this_00 == (Chromosome *)0x0) {
LAB_0010ecac:
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
                     );
      }
      gene = 0;
      while (pgVar4 = Chromosome::get_genes(this_00),
            gene < (ulong)((long)(pgVar4->
                                 super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pgVar4->
                                 super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3)) {
        auStack_78 = (undefined1  [8])0x0;
        av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        chr.pn.pi_ = (sp_counted_base *)get_phenotype(this,chrom,gene,0);
        local_38.content = (placeholder *)operator_new(0x10);
        (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0011d848;
        local_38.content[1]._vptr_placeholder = (_func_int **)chr.pn.pi_;
        if (av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
            super__Vector_impl_data._M_start ==
            av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<boost::any,_std::allocator<boost::any>_>::_M_realloc_insert<boost::any>
                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78,
                     (iterator)
                     av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
           super__Vector_impl_data._M_start)->content = (placeholder *)local_38;
          local_38.content = (placeholder *)0x0;
          av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
          super__Vector_impl_data._M_start =
               av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        if (local_38.content != (placeholder *)0x0) {
          (*(local_38.content)->_vptr_placeholder[1])();
        }
        if (this_00 == (Chromosome *)0x0) goto LAB_0010ecac;
        chr.pn.pi_ = (sp_counted_base *)get_phenotype(this,chrom,gene,this_00->ALLELE_SIZE);
        local_38.content = (placeholder *)operator_new(0x10);
        (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0011d848;
        local_38.content[1]._vptr_placeholder = (_func_int **)chr.pn.pi_;
        if (av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
            super__Vector_impl_data._M_start ==
            av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<boost::any,_std::allocator<boost::any>_>::_M_realloc_insert<boost::any>
                    ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78,
                     (iterator)
                     av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_38);
        }
        else {
          (av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
           super__Vector_impl_data._M_start)->content = (placeholder *)local_38;
          local_38.content = (placeholder *)0x0;
          av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
          super__Vector_impl_data._M_start =
               av.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        if (local_38.content != (placeholder *)0x0) {
          (*(local_38.content)->_vptr_placeholder[1])();
        }
        iVar1 = (*pWVar2->_vptr_World[6])(pWVar2);
        dVar5 = (double)(*(code *)CONCAT44(extraout_var,iVar1))
                                  ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78);
        local_40 = local_40 + dVar5;
        std::vector<boost::any,_std::allocator<boost::any>_>::~vector
                  ((vector<boost::any,_std::allocator<boost::any>_> *)auStack_78);
        gene = gene + 1;
        if (this_00 == (Chromosome *)0x0) goto LAB_0010ecac;
      }
      boost::detail::shared_count::~shared_count((shared_count *)&chr);
      chrom = chrom + 1;
      psVar3 = (this->chroms).
               super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (chrom < (ulong)((long)(this->chroms).
                                   super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  return local_40;
}

Assistant:

double Creature::make_fitness()
{
	if(!pntpop)
		return 0;

	const World* wld = pntpop->get_world();
	if(!wld)
		return 0;

	double ret = 0;

	for(size_t h = 0; h < chroms.size(); ++h)
	{
		boost::shared_ptr<Chromosome> chr = chroms[h];

		for(size_t i = 0; i < chr->get_genes().size(); ++i)
		{
			std::vector<any> av;
			av.push_back(get_phenotype(h, i, 0));
			av.push_back(get_phenotype(h, i, chr->ALLELE_SIZE));

			ret += (wld->get_fitfun())(av);
		}
	}

	return ret;

}